

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O0

Foo * squall::detail::Fetch<Foo_*,_(squall::detail::FetchContext)0>::doit
                (HSQUIRRELVM vm,SQInteger index)

{
  bool bVar1;
  KlassTable *this;
  HSQUIRRELVM local_38;
  SQUserPointer r;
  HSQOBJECT sqo;
  SQInteger index_local;
  HSQUIRRELVM vm_local;
  
  sqo._unVal.nInteger = index;
  this = klass_table(vm);
  bVar1 = KlassTable::find_klass_object<Foo>(this,(HSQOBJECT *)&r);
  if (bVar1) {
    check_argument_type<(squall::detail::FetchContext)0>(vm,sqo._unVal.nInteger,OT_INSTANCE);
    sq_getinstanceup(vm,sqo._unVal.nInteger,(SQUserPointer *)sqo._0_8_,r);
    vm_local = local_38;
  }
  else {
    vm_local = (HSQUIRRELVM)
               getdata<void*,(squall::detail::FetchContext)0,long_long(*)(SQVM*,long_long,void**)>
                         (vm,sqo._unVal.nInteger,OT_USERPOINTER,sq_getuserpointer);
  }
  return (Foo *)vm_local;
}

Assistant:

static T* doit(HSQUIRRELVM vm, SQInteger index) {
        HSQOBJECT sqo;
        if (klass_table(vm).find_klass_object<T>(sqo)) {
            check_argument_type<FC>(vm, index, OT_INSTANCE);
            SQUserPointer r;
            sq_getinstanceup(vm, index, &r, NULL);
            return (T*)r;
        } else {
            return (T*)getdata<SQUserPointer, FC>(
                vm, index, OT_USERPOINTER, sq_getuserpointer);
        }
    }